

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O3

array * cs::parse_cmd_args(array *__return_storage_ptr__,int argc,char **argv)

{
  long lVar1;
  array arg;
  any local_90;
  _Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map(&local_88,0);
  if (argc != 0) {
    lVar1 = (long)argc;
    do {
      cs_impl::any::make_constant<std::__cxx11::string,char*&>(&local_90,argv);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_88,&local_90);
      cs_impl::any::recycle(&local_90);
      argv = argv + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
            (&__return_storage_ptr__->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>
             ,&local_88);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

array parse_cmd_args(int argc, char *argv[])
	{
		cs::array arg;
		for (std::size_t i = 0; i < argc; ++i)
			arg.emplace_back(cs::var::make_constant<cs::string>(argv[i]));
		return std::move(arg);
	}